

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::reserve
          (SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *this,
          size_t count)

{
  VariableID VVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  size_t sVar6;
  unsigned_long uVar7;
  unsigned_long *puVar8;
  CombinedImageSamplerParameter *pCVar9;
  CombinedImageSamplerParameter *pCVar10;
  CombinedImageSamplerParameter *local_58;
  ulong local_38;
  size_t i;
  CombinedImageSamplerParameter *new_buffer;
  unsigned_long local_20;
  size_t target_capacity;
  size_t count_local;
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *this_local;
  
  target_capacity = count;
  count_local = (size_t)this;
  uVar7 = ::std::numeric_limits<unsigned_long>::max();
  sVar6 = target_capacity;
  if ((uVar7 >> 4 < count) ||
     (uVar7 = ::std::numeric_limits<unsigned_long>::max(), uVar7 >> 1 < sVar6)) {
    ::std::terminate();
  }
  if (this->buffer_capacity < target_capacity) {
    local_20 = this->buffer_capacity;
    if (local_20 == 0) {
      local_20 = 1;
    }
    new_buffer = (CombinedImageSamplerParameter *)0x8;
    puVar8 = ::std::max<unsigned_long>(&local_20,(unsigned_long *)&new_buffer);
    for (local_20 = *puVar8; local_20 < target_capacity; local_20 = local_20 << 1) {
    }
    if (local_20 < 9) {
      local_58 = AlignedBuffer<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::data
                           (&this->stack_storage);
    }
    else {
      local_58 = (CombinedImageSamplerParameter *)malloc(local_20 << 4);
    }
    if (local_58 == (CombinedImageSamplerParameter *)0x0) {
      ::std::terminate();
    }
    if (local_58 !=
        (this->super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>).ptr) {
      for (local_38 = 0;
          local_38 <
          (this->super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>).
          buffer_size; local_38 = local_38 + 1) {
        pCVar9 = local_58 + local_38;
        pCVar10 = (this->super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>)
                  .ptr + local_38;
        VVar1.id = (pCVar10->image_id).id;
        pCVar9->id = (VariableID)(pCVar10->id).id;
        pCVar9->image_id = (VariableID)VVar1.id;
        bVar2 = pCVar10->global_image;
        bVar3 = pCVar10->global_sampler;
        bVar4 = pCVar10->depth;
        uVar5 = pCVar10->field_0xf;
        pCVar9->sampler_id = (VariableID)(pCVar10->sampler_id).id;
        pCVar9->global_image = bVar2;
        pCVar9->global_sampler = bVar3;
        pCVar9->depth = bVar4;
        pCVar9->field_0xf = uVar5;
      }
    }
    pCVar9 = (this->super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>).ptr;
    pCVar10 = AlignedBuffer<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::data
                        (&this->stack_storage);
    if (pCVar9 != pCVar10) {
      free((this->super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>).ptr);
    }
    (this->super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>).ptr =
         local_58;
    this->buffer_capacity = local_20;
  }
  return;
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}